

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinePath.cpp
# Opt level: O1

void __thiscall
chrono::geometry::ChLinePath::AddSubLine
          (ChLinePath *this,shared_ptr<chrono::geometry::ChLine> *mline,double duration)

{
  iterator iVar1;
  pointer pdVar2;
  pointer pdVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  double dVar7;
  double local_20;
  double local_18;
  
  local_18 = duration;
  std::
  vector<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
  ::push_back(&this->lines,mline);
  local_20 = 0.0;
  iVar1._M_current =
       (this->durations).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->durations).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&this->durations,iVar1,&local_20);
  }
  else {
    *iVar1._M_current = 0.0;
    (this->durations).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  local_20 = 0.0;
  iVar1._M_current =
       (this->end_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->end_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&this->end_times,iVar1,&local_20);
  }
  else {
    *iVar1._M_current = 0.0;
    (this->end_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  pdVar2 = (this->durations).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(this->lines).
                super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->lines).
                super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4;
  pdVar2[lVar4 + -1] = local_18;
  if (lVar4 == 1) {
    dVar7 = 0.0;
  }
  else {
    dVar7 = (this->end_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar4 + -2];
  }
  pdVar3 = (this->end_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (long)(this->end_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar3 >> 3;
  if (lVar4 - 1U < uVar5) {
    lVar6 = (uVar5 - lVar4) + 1;
    do {
      dVar7 = dVar7 + pdVar2[lVar4 + -1];
      pdVar3[lVar4 + -1] = dVar7;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  return;
}

Assistant:

void ChLinePath::AddSubLine(std::shared_ptr<ChLine> mline, double duration) {
    lines.push_back(mline);
    durations.push_back(0);
    end_times.push_back(0);
    SetSubLineDurationN(lines.size() - 1, duration);
}